

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall cs_impl::array_cs_ext::back(array_cs_ext *this,array *arr)

{
  proxy *ppVar1;
  _Elt_pointer paVar2;
  long *plVar3;
  uint *local_38;
  long local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  paVar2 = (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (paVar2 != (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (paVar2 == (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      paVar2 = (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVar1 = paVar2[-1].mDat;
    if (ppVar1 != (proxy *)0x0) {
      ppVar1->refcount = ppVar1->refcount + 1;
    }
    *(proxy **)this = ppVar1;
    return (var)(proxy *)this;
  }
  plVar3 = (long *)__cxa_allocate_exception(0x20);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Call back() on empty array.","");
  *plVar3 = (long)(plVar3 + 2);
  if (local_38 == &local_28) {
    *(uint *)(plVar3 + 2) = local_28;
    *(undefined4 *)((long)plVar3 + 0x14) = uStack_24;
    *(undefined4 *)(plVar3 + 3) = uStack_20;
    *(undefined4 *)((long)plVar3 + 0x1c) = uStack_1c;
  }
  else {
    *plVar3 = (long)local_38;
    plVar3[2] = CONCAT44(uStack_24,local_28);
  }
  plVar3[1] = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffff00;
  local_38 = &local_28;
  __cxa_throw(plVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

bool isalnum(char c)
		{
			return std::isalnum(c);
		}